

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

bool jsoncons::operator<(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                         *lhs,key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                              *rhs)

{
  bool bVar1;
  type_conflict9 tVar2;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *in_RDI;
  bool local_1;
  
  bVar1 = std::operator<(in_RDI,in_RSI);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_RSI);
    if ((bVar1) &&
       (tVar2 = operator<((basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                           *)in_RDI,
                          (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                           *)in_RSI), tVar2)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool operator<(const key_value& lhs, const key_value& rhs) noexcept
        {
            if (lhs.key_ < rhs.key_)
            {
                return true;
            }
            if (lhs.key_ == rhs.key_ && lhs.value_ < rhs.value_)
            {
                return true;
            }
            return false;
        }